

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Point2f __thiscall
pbrt::WindowedPiecewiseConstant2D::Sample
          (WindowedPiecewiseConstant2D *this,Point2f *u,Bounds2f *b,Float *pdf)

{
  anon_class_24_3_6b4c7fa8 func;
  anon_class_24_3_3815fa30 func_00;
  Float *in_RCX;
  Point2<float> *in_RDX;
  Tuple2<pbrt::Point2,_float> *in_RSI;
  Float *in_RDI;
  Float FVar1;
  float fVar2;
  anon_class_24_3_3815fa30 Py;
  Float sumby;
  Bounds2f by;
  int nx;
  Point2f p;
  anon_class_24_3_6b4c7fa8 Px;
  Float sumb;
  Float *pFVar3;
  Point2<float> *in_stack_ffffffffffffff10;
  Point2<float> *this_00;
  Point2<float> *p1;
  Bounds2f *b_00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  float n;
  Float in_stack_ffffffffffffff2c;
  float max;
  Bounds2f *in_stack_ffffffffffffff38;
  SummedAreaTable *in_stack_ffffffffffffff40;
  float *pfVar4;
  undefined8 in_stack_ffffffffffffff48;
  Float *in_stack_ffffffffffffff50;
  Bounds2f local_94;
  float local_80 [2];
  float local_78;
  Float *local_70;
  Point2<float> *local_68;
  Point2<float> *local_60;
  int local_54;
  Float local_50;
  Float FStack_4c;
  Float *local_48;
  Point2<float> *local_40;
  Point2<float> *local_38;
  undefined1 local_2c [12];
  Point2<float> *local_20;
  Tuple2<pbrt::Point2,_float> *local_18;
  Tuple2<pbrt::Point2,_float> local_8;
  
  local_2c._4_8_ = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  FVar1 = SummedAreaTable::Sum(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((FVar1 != 0.0) || (NAN(FVar1))) {
    local_2c._0_4_ = SummedAreaTable::Sum(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_40 = local_20;
    local_38 = (Point2<float> *)local_2c;
    local_48 = in_RDI;
    Point2<float>::Point2(in_stack_ffffffffffffff10);
    local_54 = Array2D<float>::xSize((Array2D<float> *)(in_RDI + 8));
    local_70 = local_48;
    local_68 = local_40;
    local_60 = local_38;
    Tuple2<pbrt::Point2,_float>::operator[](local_18,0);
    func.b = (Bounds2f *)in_stack_ffffffffffffff48;
    func.this = (WindowedPiecewiseConstant2D *)in_stack_ffffffffffffff40;
    func.sumb = in_stack_ffffffffffffff50;
    pFVar3 = local_70;
    this_00 = local_68;
    p1 = local_60;
    local_50 = sample<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_1_>
                         (func,(Float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),
                          in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    std::floor((double)(ulong)(uint)(local_50 * (float)local_54));
    Point2<float>::Point2(this_00,(float)((ulong)pFVar3 >> 0x20),SUB84(pFVar3,0));
    std::ceil((double)(ulong)(uint)(local_50 * (float)local_54));
    Point2<float>::Point2(this_00,(float)((ulong)pFVar3 >> 0x20),SUB84(pFVar3,0));
    Bounds2<float>::Bounds2
              ((Bounds2<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),p1,
               this_00);
    if ((local_80[0] == local_78) && (!NAN(local_80[0]) && !NAN(local_78))) {
      local_78 = 1.0 / (float)local_54 + local_78;
    }
    FVar1 = SummedAreaTable::Sum(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if ((FVar1 != 0.0) || (NAN(FVar1))) {
      local_94.pMin.super_Tuple2<pbrt::Point2,_float>.x =
           SummedAreaTable::Sum(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      pfVar4 = local_80;
      b_00 = &local_94;
      pFVar3 = in_RDI;
      fVar2 = Tuple2<pbrt::Point2,_float>::operator[](local_18,1);
      n = (local_20->super_Tuple2<pbrt::Point2,_float>).y;
      max = local_20[1].super_Tuple2<pbrt::Point2,_float>.y;
      Array2D<float>::ySize((Array2D<float> *)(in_RDI + 8));
      func_00.by = b_00;
      func_00.this = (WindowedPiecewiseConstant2D *)pfVar4;
      func_00.sumby = pFVar3;
      FStack_4c = sample<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_2_>
                            (func_00,(Float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),max,(int)n);
      FVar1 = PDF((WindowedPiecewiseConstant2D *)CONCAT44(max,n),
                  (Point2f *)CONCAT44(fVar2,in_stack_ffffffffffffff20),b_00);
      *(Float *)local_2c._4_8_ = FVar1;
      local_8.y = FStack_4c;
      local_8.x = local_50;
    }
    else {
      *(Float *)local_2c._4_8_ = 0.0;
      Point2<float>::Point2(this_00);
    }
  }
  else {
    *(Float *)local_2c._4_8_ = 0.0;
    Point2<float>::Point2(in_stack_ffffffffffffff10);
  }
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sample(const Point2f &u, const Bounds2f &b, Float *pdf) const {
        // Handle zero-valued function for windowed sampling
        if (sat.Sum(b) == 0) {
            *pdf = 0;
            return {};
        }

        // Sample marginal windowed function in the first dimension
        Float sumb = sat.Sum(b);
        auto Px = [&, this](Float x) -> Float {
            Bounds2f bx = b;
            bx.pMax.x = x;
            return sat.Sum(bx) / sumb;
        };
        Point2f p;
        int nx = func.xSize();
        p.x = sample(Px, u[0], b.pMin.x, b.pMax.x, nx);

        // Sample conditional windowed function in the second dimension
        Bounds2f by(Point2f(std::floor(p.x * nx) / nx, b.pMin.y),
                    Point2f(std::ceil(p.x * nx) / nx, b.pMax.y));
        if (by.pMin.x == by.pMax.x)
            by.pMax.x += 1.f / nx;
        if (sat.Sum(by) == 0) {
            // This can happen when we're provided a really narrow initial
            // bounding box
            *pdf = 0;
            return {};
        }
        Float sumby = sat.Sum(by);
        auto Py = [&, this](Float y) -> Float {
            Bounds2f byy = by;
            byy.pMax.y = y;
            return sat.Sum(byy) / sumby;
        };
        p.y = sample(Py, u[1], b.pMin.y, b.pMax.y, func.ySize());

        // Compute PDF and return point sampled from windowed function
        *pdf = PDF(p, b);
        return p;
    }